

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  string *value1;
  bool bVar1;
  CppType CVar2;
  Descriptor *pDVar3;
  FieldDescriptor *this;
  FieldDescriptor *this_00;
  int32 value;
  int32 value_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  string sStack_88;
  string local_68;
  string local_48;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pDVar3 = FieldDescriptor::message_type(field);
    this = Descriptor::FindFieldByNumber(pDVar3,1);
    pDVar3 = FieldDescriptor::message_type(field);
    this_00 = Descriptor::FindFieldByNumber(pDVar3,2);
    value1 = *(string **)field;
    TypeName_abi_cxx11_(&sStack_88,(ruby *)this,field_01);
    TypeName_abi_cxx11_(&local_68,(ruby *)this_00,field_02);
    IntToString_abi_cxx11_(&local_48,(ruby *)(ulong)*(uint *)(field + 0x38),value);
    io::Printer::Print(printer,"map :$name$, :$key_type$, :$value_type$, $number$","name",value1,
                       "key_type",&sStack_88,"value_type",&local_68,"number",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    CVar2 = FieldDescriptor::cpp_type(this_00);
    if (CVar2 == CPPTYPE_MESSAGE) {
LAB_0027079b:
      pDVar3 = FieldDescriptor::message_type(this_00);
      goto LAB_002707c9;
    }
    CVar2 = FieldDescriptor::cpp_type(this_00);
  }
  else {
    LabelForField_abi_cxx11_(&sStack_88,(ruby *)field,field_00);
    io::Printer::Print(printer,"$label$ :$name$, ","label",&sStack_88,"name",*(string **)field);
    std::__cxx11::string::~string((string *)&sStack_88);
    TypeName_abi_cxx11_(&sStack_88,(ruby *)field,field_03);
    IntToString_abi_cxx11_(&local_68,(ruby *)(ulong)*(uint *)(field + 0x38),value_00);
    io::Printer::Print(printer,":$type$, $number$","type",&sStack_88,"number",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    CVar2 = FieldDescriptor::cpp_type(field);
    this_00 = field;
    if (CVar2 == CPPTYPE_MESSAGE) goto LAB_0027079b;
    CVar2 = FieldDescriptor::cpp_type(field);
  }
  if (CVar2 != CPPTYPE_ENUM) {
    io::Printer::Print(printer,"\n");
    return;
  }
  pDVar3 = (Descriptor *)FieldDescriptor::enum_type(this_00);
LAB_002707c9:
  io::Printer::Print(printer,", \"$subtype$\"\n","subtype",*(string **)(pDVar3 + 8));
  return;
}

Assistant:

void GenerateField(const google::protobuf::FieldDescriptor* field,
                   google::protobuf::io::Printer* printer) {

  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", IntToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", IntToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  }
}